

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O1

ssize_t asl::Xdl::read(int __fd,void *__buf,size_t __nbytes)

{
  int *piVar1;
  longlong t;
  size_t sVar2;
  ssize_t sVar3;
  size_t __nbytes_00;
  int iVar4;
  undefined4 in_register_0000003c;
  XdlParser *this;
  Array<char> buffer;
  byte bom [3];
  TextFile tfile;
  XdlParser parser;
  Array<char> local_c8;
  char local_bb;
  char local_ba;
  char local_b9;
  File local_b8;
  XdlParser local_70;
  
  this = (XdlParser *)CONCAT44(in_register_0000003c,__fd);
  XdlParser::XdlParser(&local_70);
  TextFile::TextFile((TextFile *)&local_b8,(String *)__buf,READ);
  if (local_b8._file != (FILE *)0x0) {
    sVar2 = File::size(&local_b8);
    if (0 < (long)sVar2) {
      __nbytes_00 = 100000;
      if ((long)sVar2 < 100000) {
        __nbytes_00 = sVar2;
      }
      iVar4 = 0x3ffe;
      if ((int)__nbytes_00 < 0x3ffe) {
        iVar4 = (int)__nbytes_00;
      }
      Array<char>::alloc(&local_c8,iVar4 + 1);
      sVar3 = File::read(&local_b8,(int)&local_bb,(void *)0x3,__nbytes_00);
      if (((int)sVar3 == 3) && (((local_bb != -0x11 || (local_ba != -0x45)) || (local_b9 != -0x41)))
         ) {
        File::seek(&local_b8,0,START);
      }
      do {
        sVar3 = File::read(&local_b8,(int)local_c8._a,
                           (void *)(ulong)(*(int *)(local_c8._a + -0x10) - 1),__nbytes_00);
        __nbytes_00 = (size_t)(int)sVar3;
        local_c8._a[__nbytes_00] = '\0';
        XdlParser::parse(&local_70,local_c8._a);
      } while (*(int *)(local_c8._a + -0x10) + -1 <= (int)sVar3);
      XdlParser::parse(&local_70," ");
      XdlParser::value(this);
      LOCK();
      piVar1 = (int *)(local_c8._a + -8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        free(local_c8._a + -0x10);
        local_c8._a = (char *)0x0;
      }
      goto LAB_0012a921;
    }
  }
  *(undefined4 *)&this->_vptr_XdlParser = 0;
  this->_state = '\0';
  this->_prevState = '\0';
  *(undefined6 *)&this->field_0xa = 0;
LAB_0012a921:
  File::~File(&local_b8);
  XdlParser::~XdlParser(&local_70);
  return (ssize_t)this;
}

Assistant:

Var Xdl::read(const String& file)
{
	XdlParser parser;
	TextFile tfile(file, File::READ);
	if (!tfile)
		return Var();
	int size = int(clamp(tfile.size(), 0ll, 100000ll));
	if (size == 0)
		return Var();
	Array<char> buffer(min(16382, size) + 1);
	byte bom[3];
	if(tfile.read(bom, 3) == 3 && !(bom[0] == 0xef && bom[1] == 0xbb && bom[2] == 0xbf))
		tfile.seek(0);
	while (1)
	{
		int n = tfile.read(buffer.data(), buffer.length() - 1);
		buffer[n] = '\0';
		parser.parse(buffer.data());
		if (n < buffer.length() - 1)
			break;
	}
	parser.parse(" ");
	return parser.value();
}